

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O1

int __thiscall FParser::FindOperator(FParser *this,int start,int stop,char *value)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int i;
  
  if (start <= stop) {
    lVar4 = 0;
    iVar2 = 0;
    do {
      if (this->TokenType[start + lVar4] == operator_) {
        cVar1 = *this->Tokens[start + lVar4];
        iVar3 = -(uint)(cVar1 == ')');
        if (cVar1 == '(') {
          iVar3 = 1;
        }
        iVar2 = iVar2 + iVar3;
        if (iVar2 == 0) {
          iVar3 = strcmp(value,this->Tokens[start + lVar4]);
          iVar2 = 0;
          if (iVar3 == 0) {
            return start + (int)lVar4;
          }
        }
      }
      lVar4 = lVar4 + 1;
    } while (~stop + start + (int)lVar4 != 0);
  }
  return -1;
}

Assistant:

int FParser::FindOperator(int start, int stop, const char *value)
{
	int i;
	int bracketlevel = 0;
	
	for(i=start; i<=stop; i++)
    {
		// only interested in operators
		if(TokenType[i] != operator_) continue;
		
		// use bracketlevel to check the number of brackets
		// which we are inside
		bracketlevel += Tokens[i][0]=='(' ? 1 :
		Tokens[i][0]==')' ? -1 : 0;
		
		// only check when we are not in brackets
		if(!bracketlevel && !strcmp(value, Tokens[i]))
			return i;
    }
	
	return -1;
}